

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

string * google::protobuf::StringPrintfVector
                   (char *format,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *v)

{
  size_type sVar1;
  undefined8 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  int i_1;
  int i;
  char *cstr [32];
  LogMessage *in_stack_fffffffffffffc98;
  LogMessage *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffcb0;
  undefined8 in_stack_fffffffffffffd28;
  int value;
  LogMessage *in_stack_fffffffffffffd30;
  uint local_1a0;
  int local_19c;
  undefined8 local_198 [34];
  byte local_81;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  undefined8 local_40;
  
  value = (int)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffca8 >> 0x20);
  local_48 = in_RDX;
  local_40 = in_RSI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  local_81 = 0;
  if (0x20 < sVar1) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffcb0,level,(char *)in_stack_fffffffffffffca0,
               (int)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    local_81 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    internal::LogMessage::operator<<(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    internal::LogMessage::operator<<(in_stack_fffffffffffffd30,value);
    internal::LogMessage::operator<<(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    internal::LogMessage::operator<<(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x4afcc0);
  }
  for (local_19c = 0;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_48), (ulong)(long)local_19c < sVar1; local_19c = local_19c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_48,(long)local_19c);
    uVar2 = std::__cxx11::string::c_str();
    local_198[local_19c] = uVar2;
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_48);
  for (local_1a0 = (uint)sVar1; local_1a0 < 0x20; local_1a0 = local_1a0 + 1) {
    local_198[(int)local_1a0] = string_printf_empty_block;
  }
  StringPrintf_abi_cxx11_
            ((char *)in_RDI,local_40,local_198[0],local_198[1],local_198[2],local_198[3],
             local_198[4],local_198[5],local_198[6],local_198[7],local_198[8],local_198[9],
             local_198[10],local_198[0xb],local_198[0xc],local_198[0xd],local_198[0xe],
             local_198[0xf],local_198[0x10],local_198[0x11],local_198[0x12],local_198[0x13],
             local_198[0x14],local_198[0x15],local_198[0x16],local_198[0x17],local_198[0x18],
             local_198[0x19],local_198[0x1a],local_198[0x1b],local_198[0x1c],local_198[0x1d],
             local_198[0x1e],local_198[0x1f]);
  return in_RDI;
}

Assistant:

string StringPrintfVector(const char* format, const std::vector<string>& v) {
  GOOGLE_CHECK_LE(v.size(), kStringPrintfVectorMaxArgs)
      << "StringPrintfVector currently only supports up to "
      << kStringPrintfVectorMaxArgs << " arguments. "
      << "Feel free to add support for more if you need it.";

  // Add filler arguments so that bogus format+args have a harder time
  // crashing the program, corrupting the program (%n),
  // or displaying random chunks of memory to users.

  const char* cstr[kStringPrintfVectorMaxArgs];
  for (int i = 0; i < v.size(); ++i) {
    cstr[i] = v[i].c_str();
  }
  for (int i = v.size(); i < GOOGLE_ARRAYSIZE(cstr); ++i) {
    cstr[i] = &string_printf_empty_block[0];
  }

  // I do not know any way to pass kStringPrintfVectorMaxArgs arguments,
  // or any way to build a va_list by hand, or any API for printf
  // that accepts an array of arguments.  The best I can do is stick
  // this COMPILE_ASSERT right next to the actual statement.

  GOOGLE_COMPILE_ASSERT(kStringPrintfVectorMaxArgs == 32, arg_count_mismatch);
  return StringPrintf(format,
                      cstr[0], cstr[1], cstr[2], cstr[3], cstr[4],
                      cstr[5], cstr[6], cstr[7], cstr[8], cstr[9],
                      cstr[10], cstr[11], cstr[12], cstr[13], cstr[14],
                      cstr[15], cstr[16], cstr[17], cstr[18], cstr[19],
                      cstr[20], cstr[21], cstr[22], cstr[23], cstr[24],
                      cstr[25], cstr[26], cstr[27], cstr[28], cstr[29],
                      cstr[30], cstr[31]);
}